

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::FindNextNoneWhiteSpace(XFileParser *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  
  if (this->mIsBinaryFormat == false) {
    while( true ) {
      pbVar2 = (byte *)this->mEnd;
      if (pbVar2 <= this->mP) break;
      uVar5 = this->mLineNumber;
      pbVar3 = (byte *)this->mP;
      while( true ) {
        pbVar6 = pbVar3 + 1;
        bVar1 = *pbVar3;
        iVar4 = isspace((uint)bVar1);
        if (iVar4 == 0) break;
        if (bVar1 == 10) {
          uVar5 = uVar5 + 1;
          this->mLineNumber = uVar5;
        }
        this->mP = (char *)pbVar6;
        pbVar3 = pbVar6;
        if (pbVar2 <= pbVar6) {
          return;
        }
      }
      if (bVar1 != 0x23) {
        if (bVar1 != 0x2f) {
          return;
        }
        if (*pbVar6 != 0x2f) {
          return;
        }
      }
      ReadUntilEndOfLine(this);
    }
  }
  return;
}

Assistant:

void XFileParser::FindNextNoneWhiteSpace()
{
    if( mIsBinaryFormat)
        return;

    bool running = true;
    while( running )
    {
        while( mP < mEnd && isspace( (unsigned char) *mP))
        {
            if( *mP == '\n')
                mLineNumber++;
            ++mP;
        }

        if( mP >= mEnd)
            return;

        // check if this is a comment
        if( (mP[0] == '/' && mP[1] == '/') || mP[0] == '#')
            ReadUntilEndOfLine();
        else
            break;
    }
}